

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintThreeBBShaft::Increment_q(ChConstraintThreeBBShaft *this,double deltal)

{
  double dVar1;
  undefined1 auVar2 [16];
  ChVariables *pCVar3;
  Index index;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong *local_28;
  long local_20;
  
  pCVar3 = (this->super_ChConstraintThree).variables_a;
  if (pCVar3->disabled == false) {
    ChVariables::Get_qb((ChVectorRef *)&local_28,pCVar3);
    if (local_20 != 6) goto LAB_007dac06;
    uVar4 = 6;
    if (((ulong)local_28 & 7) == 0) {
      uVar5 = -((uint)((ulong)local_28 >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar5 < 6) {
        uVar4 = (ulong)uVar5;
      }
      if (uVar5 != 0) goto LAB_007daaec;
    }
    else {
LAB_007daaec:
      uVar6 = 0;
      do {
        local_28[uVar6] =
             (ulong)(deltal * (this->Eq_a).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[uVar6] + (double)local_28[uVar6]);
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    if (uVar4 < 6) {
      do {
        local_28[uVar4] =
             (ulong)(deltal * (this->Eq_a).
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[uVar4] + (double)local_28[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar4 != 6);
    }
  }
  pCVar3 = (this->super_ChConstraintThree).variables_b;
  if (pCVar3->disabled != false) goto LAB_007dabb9;
  ChVariables::Get_qb((ChVectorRef *)&local_28,pCVar3);
  if (local_20 != 6) {
LAB_007dac06:
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 6, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 6, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                 );
  }
  uVar4 = 6;
  if (((ulong)local_28 & 7) == 0) {
    uVar5 = -((uint)((ulong)local_28 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 6) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_007dab7a;
  }
  else {
LAB_007dab7a:
    uVar6 = 0;
    do {
      local_28[uVar6] =
           (ulong)(deltal * (this->Eq_b).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array[uVar6] + (double)local_28[uVar6]);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 6) {
    do {
      local_28[uVar4] =
           (ulong)(deltal * (this->Eq_b).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array[uVar4] + (double)local_28[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 6);
  }
LAB_007dabb9:
  pCVar3 = (this->super_ChConstraintThree).variables_c;
  if (pCVar3->disabled == false) {
    dVar1 = (this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
            m_data.array[0];
    ChVariables::Get_qb((ChVectorRef *)&local_28,pCVar3);
    if (local_20 < 1) {
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                   );
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = deltal;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *local_28;
    auVar2 = vfmadd213sd_fma(auVar7,auVar8,auVar2);
    *local_28 = auVar2._0_8_;
  }
  return;
}

Assistant:

void ChConstraintThreeBBShaft::Increment_q(const double deltal) {
    if (variables_a->IsActive()) {
        variables_a->Get_qb() += Eq_a * deltal;
    }

    if (variables_b->IsActive()) {
        variables_b->Get_qb() += Eq_b * deltal;
    }

    if (variables_c->IsActive()) {
        variables_c->Get_qb()(0) += Eq_c(0) * deltal;
    }
}